

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O3

void __thiscall wasm::I64ToI32Lowering::visitCallIndirect(I64ToI32Lowering *this,CallIndirect *curr)

{
  Signature SVar1;
  Fatal local_1c8;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  CallIndirect *local_20;
  CallIndirect *curr_local;
  
  local_20 = curr;
  if (curr->isReturn == true) {
    SVar1 = HeapType::getSignature(&curr->heapType);
    if (SVar1.results.id.id == 3) {
      Fatal::Fatal(&local_1c8);
      Fatal::operator<<(&local_1c8,
                        (char (*) [62])
                        "i64 to i32 lowering of return_call values not yet implemented");
      Fatal::~Fatal(&local_1c8);
    }
  }
  local_40._M_unused._M_object = &local_20;
  local_28 = std::
             _Function_handler<wasm::CallIndirect_*(std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_&,_wasm::Type),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp:282:13)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<wasm::CallIndirect_*(std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_&,_wasm::Type),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp:282:13)>
             ::_M_manager;
  local_40._8_8_ = this;
  visitGenericCall<wasm::CallIndirect>(this,curr,(BuilderFunc<wasm::CallIndirect> *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return;
}

Assistant:

void visitCallIndirect(CallIndirect* curr) {
    if (curr->isReturn && curr->heapType.getSignature().results == Type::i64) {
      Fatal()
        << "i64 to i32 lowering of return_call values not yet implemented";
    }
    visitGenericCall<CallIndirect>(
      curr, [&](std::vector<Expression*>& args, Type results) {
        std::vector<Type> params;
        for (const auto& param : curr->heapType.getSignature().params) {
          if (param == Type::i64) {
            params.push_back(Type::i32);
            params.push_back(Type::i32);
          } else {
            params.push_back(param);
          }
        }
        return builder->makeCallIndirect(curr->table,
                                         curr->target,
                                         args,
                                         Signature(Type(params), results),
                                         curr->isReturn);
      });
  }